

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O3

void duckdb_fastpforlib::fastpack(uint32_t *in,uint32_t *out,uint32_t bit)

{
  logic_error *this;
  
  switch(bit) {
  case 0:
    internal::__fastpack0(in,out);
    return;
  case 1:
    internal::__fastpack1(in,out);
    return;
  case 2:
    internal::__fastpack2(in,out);
    return;
  case 3:
    internal::__fastpack3(in,out);
    return;
  case 4:
    internal::__fastpack4(in,out);
    return;
  case 5:
    internal::__fastpack5(in,out);
    return;
  case 6:
    internal::__fastpack6(in,out);
    return;
  case 7:
    internal::__fastpack7(in,out);
    return;
  case 8:
    internal::__fastpack8(in,out);
    return;
  case 9:
    internal::__fastpack9(in,out);
    return;
  case 10:
    internal::__fastpack10(in,out);
    return;
  case 0xb:
    internal::__fastpack11(in,out);
    return;
  case 0xc:
    internal::__fastpack12(in,out);
    return;
  case 0xd:
    internal::__fastpack13(in,out);
    return;
  case 0xe:
    internal::__fastpack14(in,out);
    return;
  case 0xf:
    internal::__fastpack15(in,out);
    return;
  case 0x10:
    internal::__fastpack16(in,out);
    return;
  case 0x11:
    internal::__fastpack17(in,out);
    return;
  case 0x12:
    internal::__fastpack18(in,out);
    return;
  case 0x13:
    internal::__fastpack19(in,out);
    return;
  case 0x14:
    internal::__fastpack20(in,out);
    return;
  case 0x15:
    internal::__fastpack21(in,out);
    return;
  case 0x16:
    internal::__fastpack22(in,out);
    return;
  case 0x17:
    internal::__fastpack23(in,out);
    return;
  case 0x18:
    internal::__fastpack24(in,out);
    return;
  case 0x19:
    internal::__fastpack25(in,out);
    return;
  case 0x1a:
    internal::__fastpack26(in,out);
    return;
  case 0x1b:
    internal::__fastpack27(in,out);
    return;
  case 0x1c:
    internal::__fastpack28(in,out);
    return;
  case 0x1d:
    internal::__fastpack29(in,out);
    return;
  case 0x1e:
    internal::__fastpack30(in,out);
    return;
  case 0x1f:
    internal::__fastpack31(in,out);
    return;
  case 0x20:
    internal::__fastpack32(in,out);
    return;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid bit width for bitpacking");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
}

Assistant:

inline void fastpack(const uint32_t *__restrict in,
                     uint32_t *__restrict out, const uint32_t bit) {
  // Could have used function pointers instead of switch.
  // Switch calls do offer the compiler more opportunities for optimization in
  // theory. In this case, it makes no difference with a good compiler.
  switch (bit) {
  case 0:
    internal::__fastpack0(in, out);
    break;
  case 1:
    internal::__fastpack1(in, out);
    break;
  case 2:
    internal::__fastpack2(in, out);
    break;
  case 3:
    internal::__fastpack3(in, out);
    break;
  case 4:
    internal::__fastpack4(in, out);
    break;
  case 5:
    internal::__fastpack5(in, out);
    break;
  case 6:
    internal::__fastpack6(in, out);
    break;
  case 7:
    internal::__fastpack7(in, out);
    break;
  case 8:
    internal::__fastpack8(in, out);
    break;
  case 9:
    internal::__fastpack9(in, out);
    break;
  case 10:
    internal::__fastpack10(in, out);
    break;
  case 11:
    internal::__fastpack11(in, out);
    break;
  case 12:
    internal::__fastpack12(in, out);
    break;
  case 13:
    internal::__fastpack13(in, out);
    break;
  case 14:
    internal::__fastpack14(in, out);
    break;
  case 15:
    internal::__fastpack15(in, out);
    break;
  case 16:
    internal::__fastpack16(in, out);
    break;
  case 17:
    internal::__fastpack17(in, out);
    break;
  case 18:
    internal::__fastpack18(in, out);
    break;
  case 19:
    internal::__fastpack19(in, out);
    break;
  case 20:
    internal::__fastpack20(in, out);
    break;
  case 21:
    internal::__fastpack21(in, out);
    break;
  case 22:
    internal::__fastpack22(in, out);
    break;
  case 23:
    internal::__fastpack23(in, out);
    break;
  case 24:
    internal::__fastpack24(in, out);
    break;
  case 25:
    internal::__fastpack25(in, out);
    break;
  case 26:
    internal::__fastpack26(in, out);
    break;
  case 27:
    internal::__fastpack27(in, out);
    break;
  case 28:
    internal::__fastpack28(in, out);
    break;
  case 29:
    internal::__fastpack29(in, out);
    break;
  case 30:
    internal::__fastpack30(in, out);
    break;
  case 31:
    internal::__fastpack31(in, out);
    break;
  case 32:
    internal::__fastpack32(in, out);
    break;
  default:
	throw std::logic_error("Invalid bit width for bitpacking");
  }
}